

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon,REF_GRID ref_grid)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node_00;
  uint uVar4;
  void *__ptr;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_DBL local_128;
  REF_DBL local_120;
  REF_EDGE local_118;
  double local_100;
  double local_f8;
  double local_f0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_EDGE ref_edge;
  REF_DBL diag_system [12];
  REF_DBL eig_floor;
  REF_DBL round_off_jitter;
  REF_DBL dist;
  REF_DBL *radius;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT node;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  REF_DBL *recon_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4da,
           "ref_recon_roundoff_limit","malloc radius of REF_DBL negative");
    recon_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_node_00->max << 3);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4da
             ,"ref_recon_roundoff_limit","malloc radius of REF_DBL NULL");
      recon_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rsb = 0; ref_private_macro_code_rsb < ref_node_00->max;
          ref_private_macro_code_rsb = ref_private_macro_code_rsb + 1) {
        *(undefined8 *)((long)__ptr + (long)ref_private_macro_code_rsb * 8) = 0xbff0000000000000;
      }
      recon_local._4_4_ = ref_edge_create((REF_EDGE *)&ref_private_macro_code_rss,ref_grid);
      if (recon_local._4_4_ == 0) {
        for (radius._0_4_ = 0; (int)radius < _ref_private_macro_code_rss->n;
            radius._0_4_ = (int)radius + 1) {
          iVar2 = _ref_private_macro_code_rss->e2n[(int)radius << 1];
          iVar3 = _ref_private_macro_code_rss->e2n[(int)radius * 2 + 1];
          dVar5 = pow(ref_node_00->real[iVar3 * 0xf] - ref_node_00->real[iVar2 * 0xf],2.0);
          dVar6 = pow(ref_node_00->real[iVar3 * 0xf + 1] - ref_node_00->real[iVar2 * 0xf + 1],2.0);
          dVar7 = pow(ref_node_00->real[iVar3 * 0xf + 2] - ref_node_00->real[iVar2 * 0xf + 2],2.0);
          local_f8 = sqrt(dVar5 + dVar6 + dVar7);
          pdVar1 = (double *)((long)__ptr + (long)iVar2 * 8);
          if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
            *(double *)((long)__ptr + (long)iVar2 * 8) = local_f8;
          }
          local_f0 = local_f8;
          if (*(double *)((long)__ptr + (long)iVar2 * 8) < local_f8) {
            local_f0 = *(double *)((long)__ptr + (long)iVar2 * 8);
          }
          *(double *)((long)__ptr + (long)iVar2 * 8) = local_f0;
          pdVar1 = (double *)((long)__ptr + (long)iVar3 * 8);
          if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
            *(double *)((long)__ptr + (long)iVar3 * 8) = local_f8;
          }
          if (*(double *)((long)__ptr + (long)iVar3 * 8) < local_f8) {
            local_f8 = *(double *)((long)__ptr + (long)iVar3 * 8);
          }
          *(double *)((long)__ptr + (long)iVar3 * 8) = local_f8;
        }
        ref_edge_free(_ref_private_macro_code_rss);
        for (node1 = 0; node1 < ref_node_00->max; node1 = node1 + 1) {
          if (((-1 < node1) && (node1 < ref_node_00->max)) && (-1 < ref_node_00->global[node1])) {
            if (*(double *)((long)__ptr + (long)node1 * 8) *
                *(double *)((long)__ptr + (long)node1 * 8) * 1e+20 <= 0.0) {
              local_100 = -(*(double *)((long)__ptr + (long)node1 * 8) *
                            *(double *)((long)__ptr + (long)node1 * 8) * 1e+20);
            }
            else {
              local_100 = *(double *)((long)__ptr + (long)node1 * 8) *
                          *(double *)((long)__ptr + (long)node1 * 8) * 1e+20;
            }
            if (local_100 <= 4e-12) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4f1,"ref_recon_roundoff_limit",
                     "element with zero edge length or missing element");
              return 1;
            }
            diag_system[0xb] =
                 4e-12 / (*(double *)((long)__ptr + (long)node1 * 8) *
                         *(double *)((long)__ptr + (long)node1 * 8));
            uVar4 = ref_matrix_diag_m(recon + node1 * 6,(REF_DBL *)&ref_edge);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4f8,"ref_recon_roundoff_limit",(ulong)uVar4,"eigen decomp");
              ref_matrix_show_m(recon + node1 * 6);
              ref_node_location(ref_node_00,node1);
              printf("eig_floor %e radius %e\n",diag_system[0xb],
                     *(undefined8 *)((long)__ptr + (long)node1 * 8));
              return uVar4;
            }
            if ((double)ref_edge <= diag_system[0xb]) {
              local_118 = (REF_EDGE)diag_system[0xb];
            }
            else {
              local_118 = ref_edge;
            }
            ref_edge = local_118;
            if (diag_system[0] <= diag_system[0xb]) {
              local_120 = diag_system[0xb];
            }
            else {
              local_120 = diag_system[0];
            }
            diag_system[0] = local_120;
            if (diag_system[1] <= diag_system[0xb]) {
              local_128 = diag_system[0xb];
            }
            else {
              local_128 = diag_system[1];
            }
            diag_system[1] = local_128;
            uVar4 = ref_matrix_form_m((REF_DBL *)&ref_edge,recon + node1 * 6);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4ff,"ref_recon_roundoff_limit",(ulong)uVar4,"re-form hess");
              return uVar4;
            }
          }
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        recon_local._4_4_ = ref_node_ghost_dbl(ref_node_00,recon,6);
        if (recon_local._4_4_ == 0) {
          recon_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x503,"ref_recon_roundoff_limit",(ulong)recon_local._4_4_,"update ghosts");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x4db,"ref_recon_roundoff_limit",(ulong)recon_local._4_4_,"edges");
      }
    }
  }
  return recon_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, node0, node1, edge;
  REF_DBL *radius, dist;
  REF_DBL round_off_jitter = 1.0e-12;
  REF_DBL eig_floor;
  REF_DBL diag_system[12];
  REF_EDGE ref_edge;

  ref_malloc_init(radius, ref_node_max(ref_node), REF_DBL, -1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    dist = sqrt(
        pow(ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0),
            2) +
        pow(ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0),
            2) +
        pow(ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0),
            2));
    if (radius[node0] < 0.0) radius[node0] = dist;
    radius[node0] = MIN(radius[node0], dist);
    if (radius[node1] < 0.0) radius[node1] = dist;
    radius[node1] = MIN(radius[node1], dist);
  }
  ref_edge_free(ref_edge);

  each_ref_node_valid_node(ref_node, node) {
    /* 2nd order central finite difference */
    RAS(ref_math_divisible((4 * round_off_jitter),
                           (radius[node] * radius[node])),
        "element with zero edge length or missing element");
    eig_floor = (4 * round_off_jitter) / (radius[node] * radius[node]);

    RSB(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp", {
      ref_matrix_show_m(&(recon[6 * node]));
      ref_node_location(ref_node, node);
      printf("eig_floor %e radius %e\n", eig_floor, radius[node]);
    });
    ref_matrix_eig(diag_system, 0) =
        MAX(ref_matrix_eig(diag_system, 0), eig_floor);
    ref_matrix_eig(diag_system, 1) =
        MAX(ref_matrix_eig(diag_system, 1), eig_floor);
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig(diag_system, 2), eig_floor);
    RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
  }
  ref_free(radius);

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}